

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall
fmt::v7::detail::format_error_code
          (detail *this,buffer<char> *out,int error_code,string_view message)

{
  uint uVar1;
  undefined4 in_register_00000014;
  buffer<char> *buf;
  uint uVar2;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  char *local_38;
  char *local_30;
  char *local_28;
  
  local_38 = (char *)CONCAT44(in_register_00000014,error_code);
  uVar2 = (uint)out;
  *(undefined8 *)(this + 0x10) = 0;
  uVar1 = -uVar2;
  if (0 < (int)uVar2) {
    uVar1 = uVar2;
  }
  uVar2 = 0x1f;
  if ((uVar1 | 1) != 0) {
    for (; (uVar1 | 1) >> uVar2 == 0; uVar2 = uVar2 - 1) {
    }
  }
  uVar1 = (uint)*(ushort *)(&DAT_00120a30 + (ulong)uVar2 * 2) -
          (uint)(uVar1 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32 +
                                  (ulong)*(ushort *)(&DAT_00120a30 + (ulong)uVar2 * 2) * 4));
  if (-1 < (int)uVar1) {
    if (message.data_ <= (char *)(0x1ec - (((ulong)out >> 0x1f & 1) + (ulong)uVar1))) {
      local_28 = ": ";
      format_str.size_ = 4;
      format_str.data_ = "{}{}";
      args.field_1.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           &local_38;
      args.desc_ = 0xcd;
      local_30 = message.data_;
      vformat_to<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                ((iterator)this,format_str,args,(locale_ref)0x0);
    }
    local_38 = "error ";
    format_str_00.size_ = 4;
    format_str_00.data_ = "{}{}";
    args_00.field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         &local_38;
    args_00.desc_ = 0x1c;
    local_28 = (char *)((ulong)out & 0xffffffff);
    vformat_to<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
              ((iterator)this,format_str_00,args_00,(locale_ref)0x0);
    if (*(ulong *)(this + 0x10) < 0x1f5) {
      return;
    }
    __assert_fail("out.size() <= inline_buffer_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/foundation/3rdparty/fmt/include/fmt/format-inl.h"
                  ,0xa3,
                  "void fmt::detail::format_error_code(detail::buffer<char> &, int, string_view)");
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/foundation/3rdparty/fmt/include/fmt/core.h"
              ,0x13d,"negative value");
}

Assistant:

FMT_FUNC void format_error_code(detail::buffer<char>& out, int error_code,
                                string_view message) FMT_NOEXCEPT {
  // Report error code making sure that the output fits into
  // inline_buffer_size to avoid dynamic memory allocation and potential
  // bad_alloc.
  out.try_resize(0);
  static const char SEP[] = ": ";
  static const char ERROR_STR[] = "error ";
  // Subtract 2 to account for terminating null characters in SEP and ERROR_STR.
  size_t error_code_size = sizeof(SEP) + sizeof(ERROR_STR) - 2;
  auto abs_value = static_cast<uint32_or_64_or_128_t<int>>(error_code);
  if (detail::is_negative(error_code)) {
    abs_value = 0 - abs_value;
    ++error_code_size;
  }
  error_code_size += detail::to_unsigned(detail::count_digits(abs_value));
  auto it = buffer_appender<char>(out);
  if (message.size() <= inline_buffer_size - error_code_size)
    format_to(it, "{}{}", message, SEP);
  format_to(it, "{}{}", ERROR_STR, error_code);
  assert(out.size() <= inline_buffer_size);
}